

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

Vec_Ptr_t * Abc_NodeGetFaninNames(Abc_Obj_t *pNode)

{
  Vec_Ptr_t *p;
  char *__s;
  size_t sVar1;
  char *__dest;
  long lVar2;
  
  p = Vec_PtrAlloc(100);
  for (lVar2 = 0; lVar2 < (pNode->vFanins).nSize; lVar2 = lVar2 + 1) {
    __s = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar2]]);
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar1 = strlen(__s);
      __dest = (char *)malloc(sVar1 + 1);
      strcpy(__dest,__s);
    }
    Vec_PtrPush(p,__dest);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NodeGetFaninNames( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pFanin;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Vec_PtrPush( vNodes, Abc_UtilStrsav(Abc_ObjName(pFanin)) );
    return vNodes;
}